

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O1

Gia_Man_t * Gia_ManRex2Gia(char *pStrInit,int fOrder,int fVerbose)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  undefined4 *__ptr;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  uint nRegs;
  int iVar9;
  uint uVar10;
  char *pStr;
  size_t sVar11;
  Gia_Man_t *pGVar12;
  size_t sVar13;
  char *pcVar14;
  Gia_Obj_t *pGVar15;
  uint *__ptr_00;
  void *pvVar16;
  Vec_Int_t *vStaTrans;
  int *piVar17;
  Vec_Int_t *p;
  Vec_Int_t *vVisited;
  uint *__ptr_01;
  void *__s;
  Gia_Man_t *p_00;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  Vec_Int_t *vStr2Sta;
  Vec_Int_t *vAlphas;
  int local_9c;
  Vec_Int_t *local_60;
  Vec_Int_t *local_58;
  uint local_4c;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  
  pStr = Gia_ManRexPreprocess(pStrInit);
  nRegs = Gia_ManRexNumInputs(pStr,&local_58,&local_60);
  sVar11 = strlen(pStr);
  if (fOrder != 0) {
    qsort(local_58->pArray,(long)local_58->nSize,4,Vec_IntSortCompare1);
  }
  printf("Input variable order: ");
  pVVar8 = local_58;
  if (0 < local_58->nSize) {
    lVar21 = 0;
    do {
      putchar((int)(char)pVVar8->pArray[lVar21]);
      lVar21 = lVar21 + 1;
    } while (lVar21 < pVVar8->nSize);
  }
  putchar(10);
  pGVar12 = Gia_ManStart(1000);
  if (pStrInit == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pStrInit);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pStrInit);
  }
  pGVar12->pName = pcVar14;
  iVar9 = pVVar8->nSize + nRegs;
  if (iVar9 != 0 && SCARRY4(pVVar8->nSize,nRegs) == iVar9 < 0) {
    iVar9 = 0;
    do {
      pGVar15 = Gia_ManAppendObj(pGVar12);
      uVar26 = *(ulong *)pGVar15;
      *(ulong *)pGVar15 = uVar26 | 0x9fffffff;
      *(ulong *)pGVar15 =
           uVar26 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGVar12->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = pGVar12->pObjs;
      if ((pGVar15 < pGVar6) || (pGVar6 + pGVar12->nObjs <= pGVar15)) goto LAB_0079b77c;
      Vec_IntPush(pGVar12->vCis,(int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2) * -0x55555555);
      if ((pGVar15 < pGVar12->pObjs) || (pGVar12->pObjs + pGVar12->nObjs <= pGVar15))
      goto LAB_0079b77c;
      iVar9 = iVar9 + 1;
    } while (iVar9 < (int)(pVVar8->nSize + nRegs));
  }
  uVar27 = nRegs + 1;
  __ptr_00 = (uint *)malloc(0x10);
  local_4c = 0x10;
  if (0xe < nRegs) {
    local_4c = uVar27;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = local_4c;
  local_40 = (size_t)(int)local_4c;
  if (local_4c == 0) {
    pvVar16 = (void *)0x0;
  }
  else {
    pvVar16 = malloc(local_40 * 4);
  }
  *(void **)(__ptr_00 + 2) = pvVar16;
  __ptr_00[1] = uVar27;
  if (pvVar16 != (void *)0x0) {
    memset(pvVar16,0,(long)(int)uVar27 * 4);
  }
  local_38 = (long)(int)uVar27;
  vStaTrans = (Vec_Int_t *)malloc(0x10);
  uVar5 = (uint)sVar11;
  uVar28 = 0x10;
  if (0xe < uVar5 - 1) {
    uVar28 = uVar5;
  }
  vStaTrans->nSize = 0;
  vStaTrans->nCap = uVar28;
  if (uVar28 == 0) {
    piVar17 = (int *)0x0;
  }
  else {
    piVar17 = (int *)malloc((long)(int)uVar28 * 4);
  }
  vStaTrans->pArray = piVar17;
  vStaTrans->nSize = uVar5;
  if (piVar17 != (int *)0x0) {
    memset(piVar17,0xff,(long)(int)uVar5 << 2);
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nSize = 0;
  p->nCap = uVar28;
  if (uVar28 == 0) {
    piVar17 = (int *)0x0;
  }
  else {
    piVar17 = (int *)malloc((long)(int)uVar28 << 2);
  }
  p->pArray = piVar17;
  iVar19 = uVar5 + 1;
  vVisited = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < uVar5) {
    iVar9 = iVar19;
  }
  vVisited->nSize = 0;
  vVisited->nCap = iVar9;
  if (iVar9 == 0) {
    piVar17 = (int *)0x0;
  }
  else {
    piVar17 = (int *)malloc((long)iVar9 << 2);
  }
  vVisited->pArray = piVar17;
  vVisited->nSize = iVar19;
  if (piVar17 != (int *)0x0) {
    memset(piVar17,0xff,(long)iVar19 << 2);
  }
  if (0 < (int)uVar5) {
    uVar26 = 0;
    do {
      cVar1 = pStr[uVar26];
      uVar10 = (uint)uVar26;
      uVar28 = uVar10;
      if (cVar1 == '(') {
LAB_0079ae43:
        Vec_IntPush(p,uVar10);
      }
      else if (cVar1 == ')') {
        iVar9 = p->nSize;
        if (iVar9 < 1) goto LAB_0079b893;
        p->nSize = iVar9 - 1U;
        uVar28 = p->pArray[iVar9 - 1U];
        if (pStr[(int)uVar28] == '|') {
          if (iVar9 == 1) goto LAB_0079b893;
          p->nSize = iVar9 - 2U;
          uVar20 = p->pArray[iVar9 - 2U];
          if (((long)(int)uVar20 < 0) || (vStaTrans->nSize <= (int)uVar20)) goto LAB_0079b855;
          piVar17 = vStaTrans->pArray;
          piVar17[(int)uVar20] = uVar28 + 1;
          if (((int)uVar28 < 0) || (vStaTrans->nSize <= (int)uVar28)) goto LAB_0079b855;
          piVar17[(int)uVar28] = uVar10;
          uVar28 = uVar20;
        }
      }
      else if (cVar1 == '|') goto LAB_0079ae43;
      if (((long)uVar26 < (long)(int)(uVar5 - 1)) && (pStr[uVar26 + 1] == '*')) {
        if (((int)uVar28 < 0) || (vStaTrans->nSize <= (int)uVar28)) {
LAB_0079b855:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar17 = vStaTrans->pArray;
        piVar17[uVar28] = uVar10 + 1;
        if ((long)vStaTrans->nSize <= (long)(uVar26 + 1)) goto LAB_0079b855;
        piVar17[uVar26 + 1] = uVar28;
      }
      uVar26 = uVar26 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar26);
  }
  if (p->nSize != 0) {
    __assert_fail("Vec_IntSize(vStack) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaRex.c"
                  ,0xfe,"Gia_Man_t *Gia_ManRex2Gia(char *, int, int)");
  }
  if (fVerbose != 0) {
    Gia_ManPrintAutom(pStr,vStaTrans);
  }
  Gia_ManHashAlloc(pGVar12);
  pVVar7 = local_60;
  local_9c = 1;
  if (1 < (int)uVar5) {
    local_9c = 1;
    uVar26 = 1;
    do {
      if ((2 < (byte)pStr[uVar26] - 0x28) && (pStr[uVar26] != 0x7c)) {
        Gia_ManCollectReached(pStr,vStaTrans,(int)uVar26,p,vVisited,local_9c);
        if (fVerbose != 0) {
          Gia_ManPrintReached(pStr,(int)uVar26,p);
        }
        if ((long)pVVar7->nSize <= (long)uVar26) goto LAB_0079b79b;
        uVar28 = pVVar8->nSize;
        uVar10 = pVVar7->pArray[uVar26] + uVar28;
        iVar9 = pGVar12->vCis->nSize;
        iVar19 = iVar9 - pGVar12->nRegs;
        if (iVar19 <= (int)uVar10) goto LAB_0079b836;
        if (((int)uVar10 < 0) || (iVar9 <= (int)uVar10)) goto LAB_0079b79b;
        piVar17 = pGVar12->vCis->pArray;
        iVar2 = piVar17[uVar10];
        if ((long)iVar2 < 0) goto LAB_0079b7d9;
        iVar3 = pGVar12->nObjs;
        if (iVar3 <= iVar2) goto LAB_0079b7d9;
        pGVar6 = pGVar12->pObjs;
        pGVar15 = (Gia_Obj_t *)((ulong)(pGVar6 + iVar2) & 0xfffffffffffffffe);
        if ((pGVar15 < pGVar6) || (pGVar6 + iVar3 <= pGVar15)) goto LAB_0079b77c;
        iVar22 = (int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2);
        uVar10 = iVar22 * -0x55555555;
        if ((int)uVar10 < 0) goto LAB_0079b817;
        uVar20 = 0xffffffff;
        if (0 < (int)uVar28) {
          uVar23 = 0;
          do {
            local_48 = (ulong)uVar10;
            if (pVVar8->pArray[uVar23] == (int)pStr[uVar26]) {
              uVar20 = (uint)uVar23;
              break;
            }
            uVar23 = uVar23 + 1;
            uVar20 = 0xffffffff;
          } while (uVar28 != uVar23);
        }
        if (iVar19 <= (int)uVar20) goto LAB_0079b836;
        if (((int)uVar20 < 0) || (iVar9 <= (int)uVar20)) goto LAB_0079b79b;
        iVar9 = piVar17[uVar20];
        if (((long)iVar9 < 0) || (iVar3 <= iVar9)) goto LAB_0079b7d9;
        pGVar15 = (Gia_Obj_t *)((ulong)(pGVar6 + iVar9) & 0xfffffffffffffffe);
        if ((pGVar15 < pGVar6) || (pGVar6 + iVar3 <= pGVar15)) goto LAB_0079b77c;
        iVar19 = (int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2);
        if (iVar19 * -0x55555555 < 0) goto LAB_0079b817;
        local_9c = local_9c + 1;
        iVar9 = Gia_ManHashAnd(pGVar12,((uint)(pGVar6 + iVar2) & 1) + iVar22 * 0x55555556,
                               ((uint)(pGVar6 + iVar9) & 1) + iVar19 * 0x55555556);
        if (0 < p->nSize) {
          lVar21 = 0;
          do {
            iVar19 = p->pArray[lVar21];
            if (((long)iVar19 < 0) || (pVVar7->nSize <= iVar19)) goto LAB_0079b79b;
            lVar24 = (long)pVVar7->pArray[iVar19];
            if ((lVar24 < 0) || ((int)nRegs < pVVar7->pArray[iVar19])) goto LAB_0079b79b;
            iVar9 = Gia_ManHashOr(pGVar12,iVar9,*(int *)((long)pvVar16 + lVar24 * 4));
            *(int *)((long)pvVar16 + lVar24 * 4) = iVar9;
            lVar21 = lVar21 + 1;
          } while (lVar21 < p->nSize);
        }
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != (uVar5 & 0x7fffffff));
  }
  p->nSize = 0;
  if (0 < pVVar8->nSize) {
    lVar21 = 0;
    do {
      lVar24 = (long)pGVar12->vCis->nSize;
      if (lVar24 - pGVar12->nRegs <= lVar21) {
LAB_0079b836:
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (lVar24 <= lVar21) goto LAB_0079b79b;
      iVar9 = pGVar12->vCis->pArray[lVar21];
      if (((long)iVar9 < 0) || (pGVar12->nObjs <= iVar9)) {
LAB_0079b7d9:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar6 = pGVar12->pObjs;
      pGVar15 = (Gia_Obj_t *)((ulong)(pGVar6 + iVar9) & 0xfffffffffffffffe);
      if ((pGVar15 < pGVar6) || (pGVar6 + pGVar12->nObjs <= pGVar15)) goto LAB_0079b77c;
      iVar19 = (int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2);
      if (iVar19 * -0x55555555 < 0) {
LAB_0079b817:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p,((uint)(pGVar6 + iVar9) & 1) + iVar19 * 0x55555556);
      lVar21 = lVar21 + 1;
    } while (lVar21 < pVVar8->nSize);
  }
  iVar9 = Gia_ManBuild1Hot(pGVar12,p);
  if (-1 < (int)nRegs) {
    uVar26 = 0;
    do {
      iVar19 = Gia_ManHashAnd(pGVar12,iVar9,*(int *)((long)pvVar16 + uVar26 * 4));
      *(int *)((long)pvVar16 + uVar26 * 4) = iVar19;
      uVar26 = uVar26 + 1;
    } while (uVar27 != uVar26);
  }
  Gia_ManHashStop(pGVar12);
  Gia_ManCollectReached(pStr,vStaTrans,0,p,vVisited,local_9c);
  if (fVerbose != 0) {
    Gia_ManPrintReached(pStr,0,p);
  }
  __ptr_01 = (uint *)malloc(0x10);
  __ptr_01[1] = 0;
  *__ptr_01 = local_4c;
  if (local_4c == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc(local_40);
  }
  *(void **)(__ptr_01 + 2) = __s;
  __ptr_01[1] = (uint)local_38;
  memset(__s,0,local_38);
  __ptr_01[1] = nRegs;
  uVar26 = (ulong)nRegs;
  if (0 < (int)nRegs) {
    memset(*(void **)(__ptr_01 + 2),0x30,uVar26);
  }
  if (0 < p->nSize) {
    lVar21 = 0;
    do {
      iVar9 = p->pArray[lVar21];
      if (pStr[iVar9] != '\0') {
        if ((iVar9 < 0) || (local_60->nSize <= iVar9)) {
LAB_0079b79b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar9 = local_60->pArray[iVar9];
        if (((long)iVar9 < 0) || ((int)nRegs <= iVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        *(undefined1 *)(*(long *)(__ptr_01 + 2) + (long)iVar9) = 0x31;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < p->nSize);
  }
  if (fVerbose != 0) {
    printf("Init state = %s\n",*(undefined8 *)(__ptr_01 + 2));
  }
  if ((int)nRegs < 0) {
LAB_0079b893:
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
  }
  __ptr_00[1] = nRegs;
  uVar4 = *(undefined4 *)((long)pvVar16 + uVar26 * 4);
  uVar5 = *__ptr_00;
  if (nRegs == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (pvVar16 == (void *)0x0) {
        pvVar16 = malloc(0x40);
      }
      else {
        pvVar16 = realloc(pvVar16,0x40);
      }
      *(void **)(__ptr_00 + 2) = pvVar16;
      uVar28 = 0x10;
    }
    else {
      uVar28 = uVar5 * 2;
      if ((int)uVar28 <= (int)uVar5) goto LAB_0079b483;
      if (pvVar16 == (void *)0x0) {
        pvVar16 = malloc((ulong)uVar5 << 3);
      }
      else {
        pvVar16 = realloc(pvVar16,(ulong)uVar5 << 3);
      }
      *(void **)(__ptr_00 + 2) = pvVar16;
    }
    if (pvVar16 == (void *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    *__ptr_00 = uVar28;
  }
LAB_0079b483:
  __ptr_00[1] = uVar27;
  if (0 < (int)nRegs) {
    memmove((void *)((long)*(void **)(__ptr_00 + 2) + 4),*(void **)(__ptr_00 + 2),uVar26 << 2);
  }
  __ptr = *(undefined4 **)(__ptr_00 + 2);
  *__ptr = uVar4;
  uVar26 = 0;
  do {
    uVar5 = __ptr[uVar26];
    if ((int)uVar5 < 0) {
LAB_0079b7ba:
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    uVar28 = uVar5 >> 1;
    if (pGVar12->nObjs <= (int)uVar28) goto LAB_0079b7ba;
    if ((~*(uint *)(pGVar12->pObjs + uVar28) & 0x1fffffff) != 0 &&
        (int)*(uint *)(pGVar12->pObjs + uVar28) < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar15 = Gia_ManAppendObj(pGVar12);
    uVar23 = *(ulong *)pGVar15;
    *(ulong *)pGVar15 = uVar23 | 0x80000000;
    pGVar6 = pGVar12->pObjs;
    if ((pGVar15 < pGVar6) || (pGVar6 + pGVar12->nObjs <= pGVar15)) {
LAB_0079b77c:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar18 = (ulong)(((uint)((int)pGVar15 - (int)pGVar6) >> 2) * -0x55555555 - uVar28 & 0x1fffffff);
    uVar25 = (ulong)((uVar5 & 1) << 0x1d);
    *(ulong *)pGVar15 = uVar25 | uVar23 & 0xffffffffc0000000 | 0x80000000 | uVar18;
    *(ulong *)pGVar15 =
         uVar25 | uVar23 & 0xe0000000c0000000 | 0x80000000 | uVar18 |
         (ulong)(pGVar12->vCos->nSize & 0x1fffffff) << 0x20;
    pGVar6 = pGVar12->pObjs;
    if ((pGVar15 < pGVar6) || (pGVar6 + pGVar12->nObjs <= pGVar15)) goto LAB_0079b77c;
    Vec_IntPush(pGVar12->vCos,(int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2) * -0x55555555);
    if (pGVar12->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(pGVar12,pGVar15 + -(ulong)((uint)*(undefined8 *)pGVar15 & 0x1fffffff),pGVar15
                      );
    }
    if ((pGVar15 < pGVar12->pObjs) || (pGVar12->pObjs + pGVar12->nObjs <= pGVar15))
    goto LAB_0079b77c;
    uVar26 = uVar26 + 1;
    if (uVar27 == uVar26) {
      Gia_ManSetRegNum(pGVar12,nRegs);
      p_00 = Gia_ManCleanup(pGVar12);
      Gia_ManStop(pGVar12);
      pcVar14 = *(char **)(__ptr_01 + 2);
      pGVar12 = Gia_ManDupZeroUndc(p_00,pcVar14,0,0,0);
      Gia_ManStop(p_00);
      if (pcVar14 != (char *)0x0) {
        free(pcVar14);
        __ptr_01[2] = 0;
        __ptr_01[3] = 0;
      }
      free(__ptr_01);
      if (local_58->pArray != (int *)0x0) {
        free(local_58->pArray);
        local_58->pArray = (int *)0x0;
      }
      if (local_58 != (Vec_Int_t *)0x0) {
        free(local_58);
      }
      if (local_60->pArray != (int *)0x0) {
        free(local_60->pArray);
        local_60->pArray = (int *)0x0;
      }
      if (local_60 != (Vec_Int_t *)0x0) {
        free(local_60);
      }
      free(__ptr);
      __ptr_00[2] = 0;
      __ptr_00[3] = 0;
      free(__ptr_00);
      if (vStaTrans->pArray != (int *)0x0) {
        free(vStaTrans->pArray);
        vStaTrans->pArray = (int *)0x0;
      }
      free(vStaTrans);
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
      if (vVisited->pArray != (int *)0x0) {
        free(vVisited->pArray);
        vVisited->pArray = (int *)0x0;
      }
      free(vVisited);
      if (pStr != (char *)0x0) {
        free(pStr);
      }
      return pGVar12;
    }
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManRex2Gia( char * pStrInit, int fOrder, int fVerbose )
{
    Gia_Man_t * pNew = NULL, * pTemp; 
    Vec_Int_t * vAlphas, * vStr2Sta, * vStaLits;
    Vec_Int_t * vStaTrans, * vStack, * vVisited;
    Vec_Str_t * vInit;
    char * pStr = Gia_ManRexPreprocess( pStrInit );
    int nStates = Gia_ManRexNumInputs( pStr, &vAlphas, &vStr2Sta );
    int i, k, iLit, Entry, nLength = strlen(pStr), nTravId = 1;
    if ( fOrder )
        Vec_IntSort( vAlphas, 0 );
//    if ( fVerbose )
    {
        printf( "Input variable order: " );
        Vec_IntForEachEntry( vAlphas, Entry, k )
            printf( "%c", (char)Entry );
        printf( "\n" );
    }
    // start AIG
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( pStrInit );
    for ( i = 0; i < Vec_IntSize(vAlphas) + nStates; i++ )
        Gia_ManAppendCi( pNew );
    // prepare automaton
    vStaLits  = Vec_IntStart( nStates + 1 );
    vStaTrans = Vec_IntStartFull( nLength );
    vStack    = Vec_IntAlloc( nLength );
    vVisited  = Vec_IntStartFull( nLength + 1 );
    for ( i = 0; i < nLength; i++ )
    {
        int Lp = i;
        if ( pStr[i] == '(' || pStr[i] == '|' )
            Vec_IntPush( vStack, i );
        else if ( pStr[i] == ')' )
        {
            int Or = Vec_IntPop( vStack );
            if ( pStr[Or] == '|' )
            {
                Lp = Vec_IntPop( vStack );
                Vec_IntWriteEntry( vStaTrans, Lp, Or + 1 );
                Vec_IntWriteEntry( vStaTrans, Or, i );
            }
            else
                Lp = Or;
        }
        if ( i < nLength - 1 && pStr[i+1] == '*' )
        {
            Vec_IntWriteEntry( vStaTrans, Lp, i+1 );
            Vec_IntWriteEntry( vStaTrans, i+1, Lp );
        }
    }
    assert( Vec_IntSize(vStack) == 0 );
    if ( fVerbose )
        Gia_ManPrintAutom( pStr, vStaTrans );

    // create next-state functions for each state
    Gia_ManHashAlloc( pNew );
    for ( i = 1; i < nLength; i++ )
    {
        int iThis, iThat, iThisLit, iInputLit;
        if ( Gia_SymbSpecial(pStr[i]) )
            continue;
        Gia_ManCollectReached( pStr, vStaTrans, i, vStack, vVisited, nTravId++ );
        if ( fVerbose )
            Gia_ManPrintReached( pStr, i, vStack );
        // create transitions from this state under this input
        iThis = Vec_IntEntry(vStr2Sta, i);
        iThisLit = Gia_Obj2Lit(pNew, Gia_ManPi(pNew, Vec_IntSize(vAlphas) + iThis));
        iInputLit = Gia_Obj2Lit(pNew, Gia_ManPi(pNew, Vec_IntFind(vAlphas, pStr[i])));
        iLit = Gia_ManHashAnd( pNew, iThisLit, iInputLit );
        Vec_IntForEachEntry( vStack, Entry, k )
        {
            iThat = Vec_IntEntry(vStr2Sta, Entry);
            iLit = Gia_ManHashOr( pNew, iLit, Vec_IntEntry(vStaLits, iThat) );
            Vec_IntWriteEntry( vStaLits, iThat, iLit );
        }
    }
    // create one-hotness
    Vec_IntClear( vStack );
    for ( i = 0; i < Vec_IntSize(vAlphas); i++ )
        Vec_IntPush( vStack, Gia_Obj2Lit(pNew, Gia_ManPi(pNew, i)) );
    iLit = Gia_ManBuild1Hot( pNew, vStack );
    // combine with outputs
    Vec_IntForEachEntry( vStaLits, Entry, k )
        Vec_IntWriteEntry( vStaLits, k, Gia_ManHashAnd(pNew, iLit, Entry) );
    Gia_ManHashStop( pNew );

    // collect initial state
    Gia_ManCollectReached( pStr, vStaTrans, 0, vStack, vVisited, nTravId++ );
    if ( fVerbose )
        Gia_ManPrintReached( pStr, 0, vStack );
    vInit = Vec_StrStart( nStates + 1 );
    Vec_StrFill( vInit, nStates, '0' );
    Vec_IntForEachEntry( vStack, Entry, k )
        if ( pStr[Entry] != '\0' )
            Vec_StrWriteEntry( vInit, Vec_IntEntry(vStr2Sta, Entry), '1' );
    if ( fVerbose )
        printf( "Init state = %s\n", Vec_StrArray(vInit) );

    // add outputs
    Vec_IntPushFirst( vStaLits, Vec_IntPop(vStaLits) );
    assert( Vec_IntSize(vStaLits) == nStates + 1 );
    Vec_IntForEachEntry( vStaLits, iLit, i )
        Gia_ManAppendCo( pNew, iLit );
    Gia_ManSetRegNum( pNew, nStates );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );

    // add initial state
    pNew = Gia_ManDupZeroUndc( pTemp = pNew, Vec_StrArray(vInit), 0, 0, 0 );
    Gia_ManStop( pTemp );
    Vec_StrFree( vInit );
/*
    Gia_ManAutomSimulate( pNew, vAlphas, "0" );
    Gia_ManAutomSimulate( pNew, vAlphas, "01" );
    Gia_ManAutomSimulate( pNew, vAlphas, "110" );
    Gia_ManAutomSimulate( pNew, vAlphas, "011" );
    Gia_ManAutomSimulate( pNew, vAlphas, "111" );
    Gia_ManAutomSimulate( pNew, vAlphas, "1111" );
    Gia_ManAutomSimulate( pNew, vAlphas, "1010" );

    Gia_ManAutomSimulate( pNew, vAlphas, "A" );
    Gia_ManAutomSimulate( pNew, vAlphas, "AD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "ABCD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "BCD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "CD" );
*/

    // cleanup
    Vec_IntFree( vAlphas );
    Vec_IntFree( vStr2Sta );
    Vec_IntFree( vStaLits );
    Vec_IntFree( vStaTrans );
    Vec_IntFree( vStack );
    Vec_IntFree( vVisited );
    ABC_FREE( pStr );
    return pNew;
}